

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_table.c
# Opt level: O2

int objc_getClassList(Class *buffer,int bufferLen)

{
  Class poVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  class_table_internal_table_enumerator *e;
  class_table_internal_table_enumerator *local_28;
  
  if (buffer == (Class *)0x0 || bufferLen == 0) {
    uVar2 = class_table->table_used;
  }
  else {
    local_28 = (class_table_internal_table_enumerator *)0x0;
    uVar4 = 0;
    uVar3 = (ulong)(uint)bufferLen;
    if (bufferLen < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      poVar1 = (Class)class_table_internal_next(class_table,&local_28);
      if (poVar1 == (Class)0x0) {
        uVar3 = uVar4 & 0xffffffff;
        break;
      }
      buffer[uVar4] = poVar1;
    }
    uVar2 = (uint)uVar3;
    free(local_28);
  }
  return uVar2;
}

Assistant:

int objc_getClassList(Class *buffer, int bufferLen)
{
	if (buffer == NULL || bufferLen == 0)
	{
		return class_table->table_used;
	}
	int count = 0;
	struct class_table_internal_table_enumerator *e = NULL;
	Class next;
	while (count < bufferLen &&
		(next = class_table_internal_next(class_table, &e)))
	{
		buffer[count++] = next;
	}
	free(e);
	return count;
}